

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void __thiscall QSslSocketPrivate::_q_disconnectedSlot(QSslSocketPrivate *this)

{
  QAbstractSocket *this_00;
  TlsCryptograph *pTVar1;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocket **)
             &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8;
  pTVar1 = (this->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
  if (pTVar1 != (TlsCryptograph *)0x0) {
    (**(code **)(*(long *)pTVar1 + 0xa8))();
  }
  QAbstractSocket::disconnected(this_00);
  QAbstractSocket::setLocalPort(this_00,0);
  QHostAddress::QHostAddress((QHostAddress *)&local_38);
  QAbstractSocket::setLocalAddress(this_00,(QHostAddress *)&local_38);
  QHostAddress::~QHostAddress((QHostAddress *)&local_38);
  QAbstractSocket::setPeerPort(this_00,0);
  QHostAddress::QHostAddress((QHostAddress *)&local_38);
  QAbstractSocket::setPeerAddress(this_00,(QHostAddress *)&local_38);
  QHostAddress::~QHostAddress((QHostAddress *)&local_38);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  QAbstractSocket::setPeerName(this_00,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_disconnectedSlot()
{
    Q_Q(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_disconnectedSlot()";
    qCDebug(lcSsl) << "\tstate =" << q->state();
#endif
    disconnected();
    emit q->disconnected();

    q->setLocalPort(0);
    q->setLocalAddress(QHostAddress());
    q->setPeerPort(0);
    q->setPeerAddress(QHostAddress());
    q->setPeerName(QString());
    cachedSocketDescriptor = -1;
}